

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
            *this,tuple<Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                  *v)

{
  tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
  *ptVar1;
  
  if ((v->base).super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>
      .value.empty_ == false) {
    ptVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
              *)&(v->base).
                 super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>
                 .value.empty_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v);
    this[0x20] = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
                  )0x0;
  }
  else {
    ptVar1 = this + 0x20;
  }
  *ptVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
             )0x1;
  if ((v->base).super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
      .value.empty_ == false) {
    ptVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
              *)&(v->base).
                 super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
                 .value.empty_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x28),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(v->base).
                super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
              );
    this[0x48] = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
                  )0x0;
  }
  else {
    ptVar1 = this + 0x48;
  }
  *ptVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
             )0x1;
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( tuple< Us... >&& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, Us&& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( std::move( v ) ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( std::move( v ) ) ), true )..., true };
#endif
        return *this;
      }